

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall SharedPtrTests_self_Self3_Test::TestBody(SharedPtrTests_self_Self3_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  SharedPtr<int> t1;
  int *a;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  SharedPtr<int> local_38;
  SharedPtr<int> local_28;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_28.data = (int *)operator_new(4);
  *local_28.data = 4;
  local_28.pointersAmount = (atomic<unsigned_long> *)0x0;
  local_10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_28.data;
  local_28.pointersAmount = (atomic<unsigned_long> *)operator_new(8);
  LOCK();
  ((local_28.pointersAmount)->super___atomic_base<unsigned_long>)._M_i = 1;
  UNLOCK();
  local_38.data = (int *)0x0;
  local_38.pointersAmount = (atomic<unsigned_long> *)0x0;
  SharedPtr<int>::operator=(&local_38,&local_28);
  SharedPtr<int>::operator=(&local_28,&local_38);
  SharedPtr<int>::~SharedPtr(&local_38);
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28.data;
  testing::internal::CmpHelperEQ<int*,int*>
            ((internal *)&local_38,"t1.get()","a",(int **)&local_48,(int **)&local_10);
  if ((char)local_38.data == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.pointersAmount == (atomic<unsigned_long> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)((local_38.pointersAmount)->super___atomic_base<unsigned_long>)._M_i;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0xa2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.pointersAmount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28.pointersAmount == (atomic<unsigned_long> *)0x0) {
    local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_48.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((local_28.pointersAmount)->super___atomic_base<unsigned_long>)._M_i;
  }
  local_40.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_38,"t1.use_count()","1",(unsigned_long *)&local_48,(int *)&local_40)
  ;
  if ((char)local_38.data == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_38.pointersAmount == (atomic<unsigned_long> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)((local_38.pointersAmount)->super___atomic_base<unsigned_long>)._M_i;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_3/tests/test.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38.pointersAmount,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  SharedPtr<int>::~SharedPtr(&local_28);
  return;
}

Assistant:

TEST(SharedPtrTests_self, Self3) {
	int* a;
	a = new int;
	*a = 4;
	SharedPtr<int> t1(a);
	std::swap(t1, t1);
	EXPECT_EQ(t1.get(),a);
	EXPECT_EQ(t1.use_count(), 1);
}